

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ecmult_near_split_bound(void)

{
  int iVar1;
  uint j;
  int i;
  int in_stack_0000028c;
  secp256k1_scalar *in_stack_00000290;
  undefined4 local_8;
  
  for (iVar1 = 0; iVar1 < COUNT * 4; iVar1 = iVar1 + 1) {
    for (local_8 = 0; local_8 < 0x14; local_8 = local_8 + 1) {
      test_ecmult_target(in_stack_00000290,in_stack_0000028c);
      test_ecmult_target(in_stack_00000290,in_stack_0000028c);
      test_ecmult_target(in_stack_00000290,in_stack_0000028c);
    }
  }
  return;
}

Assistant:

static void run_ecmult_near_split_bound(void) {
    int i;
    unsigned j;
    for (i = 0; i < 4*COUNT; ++i) {
        for (j = 0; j < sizeof(scalars_near_split_bounds) / sizeof(scalars_near_split_bounds[0]); ++j) {
            test_ecmult_target(&scalars_near_split_bounds[j], 0);
            test_ecmult_target(&scalars_near_split_bounds[j], 1);
            test_ecmult_target(&scalars_near_split_bounds[j], 2);
        }
    }
}